

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_header_parser.cc
# Opt level: O3

void __thiscall vp9_parser::Vp9HeaderParser::ParseTileInfo(Vp9HeaderParser *this)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  sbyte sVar7;
  size_t off;
  int iVar8;
  size_t off_1;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  byte bVar12;
  int iVar13;
  
  VpxReadLiteral(this,2);
  VpxReadLiteral(this,6);
  VpxReadLiteral(this,3);
  uVar9 = this->bit_offset_;
  if (uVar9 >> 3 < this->frame_size_) {
    bVar2 = this->frame_[uVar9 >> 3];
    uVar1 = uVar9 + 1;
    this->bit_offset_ = uVar1;
    if ((((bVar2 >> (~(byte)uVar9 & 7) & 1) != 0) && (uVar1 >> 3 < this->frame_size_)) &&
       (bVar2 = this->frame_[uVar1 >> 3], this->bit_offset_ = uVar9 + 2,
       (bVar2 >> (~(byte)uVar1 & 7) & 1) != 0)) {
      iVar11 = 4;
      do {
        uVar9 = this->bit_offset_;
        if ((uVar9 >> 3 < this->frame_size_) &&
           (bVar2 = this->frame_[uVar9 >> 3], this->bit_offset_ = uVar9 + 1,
           (bVar2 >> (~(byte)uVar9 & 7) & 1) != 0)) {
          VpxReadLiteral(this,7);
        }
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      bVar4 = true;
      do {
        bVar10 = bVar4;
        uVar9 = this->bit_offset_;
        if ((uVar9 >> 3 < this->frame_size_) &&
           (bVar2 = this->frame_[uVar9 >> 3], this->bit_offset_ = uVar9 + 1,
           (bVar2 >> (~(byte)uVar9 & 7) & 1) != 0)) {
          VpxReadLiteral(this,7);
        }
        bVar4 = false;
      } while (bVar10);
    }
  }
  VpxReadLiteral(this,8);
  SkipDeltaQ(this);
  SkipDeltaQ(this);
  SkipDeltaQ(this);
  uVar1 = this->frame_size_;
  uVar3 = this->bit_offset_;
  uVar9 = uVar3;
  if (uVar3 >> 3 < uVar1) {
    bVar2 = this->frame_[uVar3 >> 3];
    uVar9 = uVar3 + 1;
    this->bit_offset_ = uVar9;
    if ((bVar2 >> (~(byte)uVar3 & 7) & 1) != 0) {
      return;
    }
  }
  iVar11 = (this->width_ + 7 >> 3) + 7 >> 3;
  iVar8 = -1;
  do {
    iVar8 = iVar8 + 1;
  } while (3 < iVar11 >> ((byte)iVar8 & 0x1f));
  iVar5 = 0;
  do {
    iVar6 = iVar5;
    iVar5 = iVar6 + 1;
  } while (0x40 << ((byte)iVar6 & 0x1f) < iVar11);
  iVar11 = 1;
  if (1 < iVar8) {
    iVar11 = iVar8;
  }
  iVar5 = iVar6;
  if (iVar11 != iVar6 + 1) {
    iVar13 = 1;
    if (1 < iVar8) {
      iVar13 = iVar8;
    }
    while (iVar5 = iVar6, uVar9 >> 3 < uVar1) {
      bVar2 = this->frame_[uVar9 >> 3];
      uVar3 = uVar9 + 1;
      this->bit_offset_ = uVar3;
      bVar12 = (byte)uVar9;
      uVar9 = uVar3;
      if (((bVar2 >> (~bVar12 & 7) & 1) == 0) ||
         (iVar8 = iVar6 - iVar13, iVar6 = iVar6 + 1, iVar5 = iVar11 + -1, iVar8 == -2)) break;
    }
  }
  sVar7 = 0;
  if (uVar9 >> 3 < uVar1) {
    bVar2 = this->frame_[uVar9 >> 3];
    uVar3 = uVar9 + 1;
    this->bit_offset_ = uVar3;
    sVar7 = 0;
    if ((bVar2 >> (~(byte)uVar9 & 7) & 1) != 0) {
      sVar7 = 1;
      if (uVar3 >> 3 < uVar1) {
        bVar2 = this->frame_[uVar3 >> 3];
        this->bit_offset_ = uVar9 + 2;
        sVar7 = ((bVar2 >> (~(uint)uVar3 & 7) & 1) != 0) + 1;
      }
    }
  }
  this->row_tiles_ = 1 << sVar7;
  this->column_tiles_ = 1 << ((byte)iVar5 & 0x1f);
  return;
}

Assistant:

void Vp9HeaderParser::ParseTileInfo() {
  VpxReadLiteral(2);  // Consume frame context index

  // loopfilter
  VpxReadLiteral(6);  // Consume filter level
  VpxReadLiteral(3);  // Consume sharpness level

  const bool mode_ref_delta_enabled = ReadBit();
  if (mode_ref_delta_enabled) {
    const bool mode_ref_delta_update = ReadBit();
    if (mode_ref_delta_update) {
      const int kMaxRefLFDeltas = 4;
      for (int i = 0; i < kMaxRefLFDeltas; ++i) {
        if (ReadBit())
          VpxReadLiteral(7);  // Consume ref_deltas + sign
      }

      const int kMaxModeDeltas = 2;
      for (int i = 0; i < kMaxModeDeltas; ++i) {
        if (ReadBit())
          VpxReadLiteral(7);  // Consume mode_delta + sign
      }
    }
  }

  // quantization
  VpxReadLiteral(8);  // Consume base_q
  SkipDeltaQ();  // y dc
  SkipDeltaQ();  // uv ac
  SkipDeltaQ();  // uv dc

  // segmentation
  const bool segmentation_enabled = ReadBit();
  if (!segmentation_enabled) {
    const int aligned_width = AlignPowerOfTwo(width_, kMiSizeLog2);
    const int mi_cols = aligned_width >> kMiSizeLog2;
    const int aligned_mi_cols = AlignPowerOfTwo(mi_cols, kMiSizeLog2);
    const int sb_cols = aligned_mi_cols >> 3;  // to_sbs(mi_cols);
    int min_log2_n_tiles, max_log2_n_tiles;

    for (max_log2_n_tiles = 0;
         (sb_cols >> max_log2_n_tiles) >= kMinTileWidthB64;
         max_log2_n_tiles++) {
    }
    max_log2_n_tiles--;
    if (max_log2_n_tiles < 0)
      max_log2_n_tiles = 0;

    for (min_log2_n_tiles = 0; (kMaxTileWidthB64 << min_log2_n_tiles) < sb_cols;
         min_log2_n_tiles++) {
    }

    // columns
    const int max_log2_tile_cols = max_log2_n_tiles;
    const int min_log2_tile_cols = min_log2_n_tiles;
    int max_ones = max_log2_tile_cols - min_log2_tile_cols;
    int log2_tile_cols = min_log2_tile_cols;
    while (max_ones-- && ReadBit())
      log2_tile_cols++;

    // rows
    int log2_tile_rows = ReadBit();
    if (log2_tile_rows)
      log2_tile_rows += ReadBit();

    row_tiles_ = 1 << log2_tile_rows;
    column_tiles_ = 1 << log2_tile_cols;
  }
}